

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdDecodeSignatureFromDer
              (void *handle,char *der_signature,char **signature,int *sighash_type,
              bool *sighash_anyone_can_pay)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint32_t *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_R8;
  CfdException *except;
  exception *std_except;
  ByteData sig;
  SigHashType type;
  string *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe80;
  allocator *paVar5;
  string *in_stack_fffffffffffffec0;
  allocator local_119;
  string local_118;
  ByteData local_f8;
  ByteData local_e0;
  SigHashType local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  long local_30;
  uint32_t *local_28;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x3ac;
    local_58.funcname = "CfdDecodeSignatureFromDer";
    cfd::core::logger::warn<>(&local_58,"der_signature is null or empty.");
    local_7a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"Failed to parameter. der_signature is null or empty.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe80,error_code,in_stack_fffffffffffffe70);
    local_7a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_20 == (undefined8 *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x3b2;
    local_98.funcname = "CfdDecodeSignatureFromDer";
    cfd::core::logger::warn<>(&local_98,"signature is null.");
    local_ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. signature is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe80,error_code,in_stack_fffffffffffffe70);
    local_ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::SigHashType::SigHashType(&local_c8);
  paVar5 = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,local_18,paVar5);
  cfd::core::ByteData::ByteData(&local_f8,&local_118);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_e0,&local_f8,&local_c8);
  cfd::core::ByteData::~ByteData((ByteData *)0x5d4752);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffec0,&local_e0);
  pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffffec0);
  *local_20 = pcVar4;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  if (local_28 != (uint32_t *)0x0) {
    uVar2 = cfd::core::SigHashType::GetSigHashFlag(&local_c8);
    *local_28 = uVar2;
  }
  if (local_30 != 0) {
    bVar1 = cfd::core::SigHashType::IsAnyoneCanPay(&local_c8);
    *(bool *)local_30 = bVar1;
  }
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5d48c9);
  return local_4;
}

Assistant:

int CfdDecodeSignatureFromDer(
    void* handle, const char* der_signature, char** signature,
    int* sighash_type, bool* sighash_anyone_can_pay) {
  try {
    cfd::Initialize();
    if (IsEmptyString(der_signature)) {
      warn(CFD_LOG_SOURCE, "der_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    SigHashType type;
    ByteData sig =
        CryptoUtil::ConvertSignatureFromDer(ByteData(der_signature), &type);
    *signature = CreateString(sig.GetHex());
    if (sighash_type) *sighash_type = static_cast<int>(type.GetSigHashFlag());
    if (sighash_anyone_can_pay)
      *sighash_anyone_can_pay = type.IsAnyoneCanPay();

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}